

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

NodeIterator __thiscall
Indexing::RetrievalAlgorithms::
UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>
::_selectPotentiallyUnifiableChildren<Indexing::TermWithValue<Kernel::TermList>>
          (UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>
           *this,IntermediateNode *n,AbstractingUnifier *unif,uint normInternalBank)

{
  long *plVar1;
  int *piVar2;
  anon_class_24_2_fa5da250_for__func f;
  VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>
  VVar3;
  undefined4 in_register_0000000c;
  unsigned_long s;
  CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>_>_>
  *i;
  Top TVar4;
  Option<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_> syms
  ;
  VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>
  local_258;
  undefined1 local_250 [8];
  Value local_248;
  long *local_238;
  IntermediateNode *local_230;
  undefined8 uStack_228;
  char local_220;
  undefined7 uStack_21f;
  undefined1 local_218 [8];
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  char local_1d0;
  undefined8 local_1c8;
  Lib local_1c0 [16];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  char local_170;
  long *local_160;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  char local_110;
  undefined8 local_108;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>_>
  local_100;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>_>
  local_d8;
  IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>_>_>_>
  local_98;
  
  s = CONCAT44(in_register_0000000c,normInternalBank);
  if ((unif->_uwa)._mode == OFF) {
    __selectPotentiallyUnifiableChildren<Indexing::TermWithValue<Kernel::TermList>>
              ((RetrievalAlgorithms *)this,n,
               (RobSubstitution *)
               (unif->_subs)._self._M_t.
               super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
               ._M_t.
               super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
               .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>,normInternalBank);
  }
  else {
    TVar4 = Kernel::RobSubstitution::getSpecialVarTop
                      ((RobSubstitution *)
                       (unif->_subs)._self._M_t.
                       super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                       .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>,n->childVar,
                       normInternalBank);
    if (((undefined1  [12])TVar4._inner._inner & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
      (*(n->super_Node)._vptr_Node[8])(this,n);
    }
    else {
      Kernel::AbstractingUnifier::unifiableSymbols
                ((Option<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                  *)local_250,unif,TVar4._inner._inner._content);
      if (local_250[0] == true) {
        Lib::
        arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>
                  (&local_100,
                   (Lib *)&(((Option<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                              *)local_250)->
                           super_OptionBase<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                           )._elem,
                   (Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)(*(long *)((long)local_248.init._self._M_t.
                                       super___uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Lib::Stack<unsigned_int>_*,_std::default_delete<Lib::Stack<unsigned_int>_>_>
                                       .super__Head_base<0UL,_Lib::Stack<unsigned_int>_*,_false>.
                                       _M_head_impl + 0x10) -
                       *(long *)((long)local_248.init._self._M_t.
                                       super___uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Lib::Stack<unsigned_int>_*,_std::default_delete<Lib::Stack<unsigned_int>_>_>
                                       .super__Head_base<0UL,_Lib::Stack<unsigned_int>_*,_false>.
                                       _M_head_impl + 8) >> 2),s);
        f._17_7_ = uStack_21f;
        f.top._inner._inner._content[7] = TVar4._inner._inner._content[7];
        f.top._inner._inner._0_8_ = TVar4._inner._inner._0_8_;
        f.n = n;
        local_230 = n;
        uStack_228 = TVar4._inner._inner._0_8_;
        local_220 = TVar4._inner._inner._content[7];
        Lib::
        IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>(Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>&&,unsigned_long)::{lambda(auto:1)#1},unsigned_int>>
        ::
        map<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Indexing::TermWithValue<Kernel::TermList>>(Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_1_>
                  (&local_d8,&local_100,f);
        Lib::
        IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>(Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>&&,unsigned_long)::{lambda(auto:1)#1},unsigned_int>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Indexing::TermWithValue<Kernel::TermList>>(Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::{lambda(auto:1)#1},Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::Node**>>
        ::
        filter<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Indexing::TermWithValue<Kernel::TermList>>(Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_2_>
                  (local_218,&local_d8);
        (*(n->super_Node)._vptr_Node[9])(&local_258,n);
        local_198._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<unsigned_int>_*,_std::default_delete<Lib::Stack<unsigned_int>_>_>
        .super__Head_base<0UL,_Lib::Stack<unsigned_int>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>,_true,_true>
                )local_1f8._self;
        VVar3._core = local_258._core;
        local_150 = local_210;
        uStack_148 = uStack_208;
        local_140 = local_200;
        local_138._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<unsigned_int>_*,_std::default_delete<Lib::Stack<unsigned_int>_>_>
        .super__Head_base<0UL,_Lib::Stack<unsigned_int>_*,_false>._M_head_impl =
             local_1f8._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<unsigned_int>_*,_std::default_delete<Lib::Stack<unsigned_int>_>_>
             .super__Head_base<0UL,_Lib::Stack<unsigned_int>_*,_false>._M_head_impl;
        local_1f8._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<unsigned_int>_*,_std::default_delete<Lib::Stack<unsigned_int>_>_>
        .super__Head_base<0UL,_Lib::Stack<unsigned_int>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>,_true,_true>
              )(__uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
                )0x0;
        local_128 = local_1e8;
        uStack_120 = uStack_1e0;
        local_118 = local_1d8;
        local_110 = local_1d0;
        if (local_1d0 == '\x01') {
          local_108 = local_1c8;
        }
        if (local_258._core !=
            (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>
             *)0x0) {
          (local_258._core)->_refCnt = (local_258._core)->_refCnt + 1;
        }
        Lib::
        concatIters<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::Node**>>
                  ((Lib *)&local_238,local_258);
        local_1c0[0] = (Lib)0x1;
        local_1b0 = local_150;
        uStack_1a8 = uStack_148;
        local_1a0 = local_140;
        local_138._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<unsigned_int>_*,_std::default_delete<Lib::Stack<unsigned_int>_>_>
        .super__Head_base<0UL,_Lib::Stack<unsigned_int>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>,_true,_true>
              )(__uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
                )0x0;
        local_188 = local_128;
        uStack_180 = uStack_120;
        local_178 = local_118;
        local_170 = local_1d0;
        local_160 = local_238;
        if (local_238 != (long *)0x0) {
          *(int *)(local_238 + 1) = (int)local_238[1] + 1;
        }
        Lib::
        iterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>(Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>&&,unsigned_long)::_lambda(auto:1)_1_,unsigned_int>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Indexing::TermWithValue<Kernel::TermList>>(Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_1_,Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::Node**>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Indexing::TermWithValue<Kernel::TermList>>(Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_2_,false>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::Node**>>>>
                  (&local_98,local_1c0,i);
        if (local_160 != (long *)0x0) {
          plVar1 = local_160 + 1;
          *(int *)plVar1 = (int)*plVar1 + -1;
          if ((int)*plVar1 == 0) {
            (**(code **)(*local_160 + 8))();
          }
        }
        Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled(&local_198);
        if (local_238 != (long *)0x0) {
          plVar1 = local_238 + 1;
          *(int *)plVar1 = (int)*plVar1 + -1;
          if ((int)*plVar1 == 0) {
            (**(code **)(*local_238 + 8))(local_238);
          }
        }
        if (VVar3._core !=
            (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>
             *)0x0) {
          piVar2 = &(VVar3._core)->_refCnt;
          *piVar2 = *piVar2 + -1;
          if (*piVar2 == 0) {
            (*(VVar3._core)->_vptr_IteratorCore[1])(VVar3._core);
          }
        }
        Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled(&local_138);
        Lib::
        pvi<Lib::IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>(Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>&&,unsigned_long)::_lambda(auto:1)_1_,unsigned_int>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Indexing::TermWithValue<Kernel::TermList>>(Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_1_,Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::Node**>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Indexing::TermWithValue<Kernel::TermList>>(Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_2_,false>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>>::Node**>>>>>
                  ((Lib *)this,&local_98);
        if (local_98._iter._it2._iter._core !=
            (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>
             *)0x0) {
          piVar2 = (int *)((long)local_98._iter._it2._iter._core + 8);
          *piVar2 = *piVar2 + -1;
          if (*piVar2 == 0) {
            (*(*(_func_int ***)local_98._iter._it2._iter._core)[1])();
          }
        }
        Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
                  )&local_98._iter._it1._iter._inn._inner);
        if (local_258._core !=
            (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>
             *)0x0) {
          piVar2 = &(local_258._core)->_refCnt;
          *piVar2 = *piVar2 + -1;
          if (*piVar2 == 0) {
            (*(local_258._core)->_vptr_IteratorCore[1])();
          }
        }
        Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled(&local_1f8);
        Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
                  )&local_d8._iter._inner);
        Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
                  )&local_100);
      }
      else {
        (*(n->super_Node)._vptr_Node[8])(this,n);
      }
      if (local_250[0] == true) {
        Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
                  )&(((Option<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                       *)local_250)->
                    super_OptionBase<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                    )._elem);
      }
    }
  }
  return (NodeIterator)
         (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>
          *)this;
}

Assistant:

static typename SubstitutionTree<LD>::NodeIterator _selectPotentiallyUnifiableChildren(typename SubstitutionTree<LD>::IntermediateNode* n, AbstractingUnifier& unif, unsigned normInternalBank)
        {
          if (unif.usesUwa()) {
            unsigned specVar = n->childVar;
            auto top = unif.subs().getSpecialVarTop(specVar, normInternalBank);

            if(top.var()) {
              return n->allChildren();
            } else {
              auto syms = unif.unifiableSymbols(*top.functor());
              if (syms) {
                return pvi(concatIters(
                      arrayIter(std::move(*syms))
                        .map   ([=](auto f) { return n->childByTop(top, /* canCreate */ false); })
                        .filter([ ](auto n) { return n != nullptr; }),
                      n->variableChildren()
                      ));
              } else {
                return n->allChildren();
              }
            }
          } else {
            return __selectPotentiallyUnifiableChildren<LD>(n, unif.subs(), normInternalBank);
          }
        }